

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

bool __thiscall
HighsSymmetryDetection::compareCurrentGraph
          (HighsSymmetryDetection *this,
          HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *otherGraph,HighsInt *wrongCell)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  pointer piVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  u8 local_61;
  HighsInt local_60;
  KeyType local_5c;
  HighsInt *local_50;
  u64 local_48;
  u64 local_40;
  u64 local_38;
  
  bVar3 = this->numCol < 1;
  if (0 < this->numCol) {
    lVar6 = 0;
    local_50 = wrongCell;
    do {
      local_60 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6];
      iVar5 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6];
      bVar8 = iVar5 == (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar6];
      if (!bVar8) {
        lVar7 = (long)iVar5;
        do {
          ppVar1 = (this->Gedge).
                   super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
          super__Tuple_impl<1UL,_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
               (_Head_base<2UL,_unsigned_int,_false>)ppVar1[lVar7].second;
          local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
          super__Tuple_impl<1UL,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
               local_60;
          local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.super__Head_base<0UL,_int,_false>.
          _M_head_impl = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[ppVar1[lVar7].first];
          bVar2 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::findPosition
                            (otherGraph,&local_5c,&local_61,&local_40,&local_48,&local_38);
          if ((!bVar2) ||
             ((otherGraph->entries)._M_t.
              super___uniq_ptr_impl<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
              ._M_t.
              super__Tuple_impl<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
              .
              super__Head_base<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_false>
              ._M_head_impl == (HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)0x0)
             ) {
            *local_50 = local_60;
            if (!bVar8) {
              return bVar3;
            }
            break;
          }
          lVar7 = lVar7 + 1;
          iVar5 = iVar5 + 1;
          bVar8 = iVar5 == (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar6];
        } while (!bVar8);
      }
      piVar4 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar7 = (long)(this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6]; (int)lVar7 != piVar4[lVar6 + 1];
          lVar7 = lVar7 + 1) {
        ppVar1 = (this->Gedge).
                 super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
        super__Tuple_impl<1UL,_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
             (_Head_base<2UL,_unsigned_int,_false>)ppVar1[lVar7].second;
        local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
        super__Tuple_impl<1UL,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
             local_60;
        local_5c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.super__Head_base<0UL,_int,_false>.
        _M_head_impl = ppVar1[lVar7].first;
        bVar8 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::findPosition
                          (otherGraph,&local_5c,&local_61,&local_40,&local_48,&local_38);
        if ((!bVar8) ||
           ((otherGraph->entries)._M_t.
            super___uniq_ptr_impl<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
            .
            super__Head_base<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_false>
            ._M_head_impl == (HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)0x0))
        {
          *local_50 = local_60;
          return bVar3;
        }
        piVar4 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      lVar6 = lVar6 + 1;
      bVar3 = this->numCol <= lVar6;
    } while (lVar6 < this->numCol);
  }
  return bVar3;
}

Assistant:

bool HighsSymmetryDetection::compareCurrentGraph(
    const HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>>& otherGraph,
    HighsInt& wrongCell) {
  for (HighsInt i = 0; i < numCol; ++i) {
    HighsInt colCell = vertexToCell[i];

    for (HighsInt j = Gstart[i]; j != Gend[i]; ++j)
      if (!otherGraph.find(std::make_tuple(vertexToCell[Gedge[j].first],
                                           colCell, Gedge[j].second))) {
        // return which cell does not match in its neighbourhood as this should
        // have been detected with the hashing it can very rarely happen due to
        // a hash collision. In such a case we want to backtrack to the last
        // time where we targeted this particular cell. Otherwise we could spent
        // a long time searching for a matching leave value until every
        // combination is exhausted and for each leave in this subtree the graph
        // comparison will fail on this edge.
        wrongCell = colCell;
        return false;
      }
    for (HighsInt j = Gend[i]; j != Gstart[i + 1]; ++j)
      if (!otherGraph.find(
              std::make_tuple(Gedge[j].first, colCell, Gedge[j].second))) {
        wrongCell = colCell;
        return false;
      }
  }

  return true;
}